

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O1

LispPTR compare_lisp_chars(char *char1,char *char2,DLword length,DLword fat1,DLword fat2)

{
  undefined6 in_register_0000000a;
  uint uVar1;
  undefined6 in_register_00000012;
  ulong uVar2;
  undefined6 in_register_00000082;
  
  uVar2 = CONCAT62(in_register_00000012,length);
  if (((int)CONCAT62(in_register_0000000a,fat1) == 0) ==
      ((int)CONCAT62(in_register_00000082,fat2) != 0)) {
    if (fat1 == 0) {
      if (length != 0) {
        do {
          if (*(ushort *)((ulong)char2 ^ 2) != (ushort)*(byte *)((ulong)char1 ^ 3)) {
            return 0;
          }
          char1 = char1 + 1;
          char2 = char2 + 2;
          uVar1 = (int)uVar2 - 1;
          uVar2 = (ulong)uVar1;
        } while (uVar1 != 0);
      }
    }
    else if (length != 0) {
      do {
        if (*(ushort *)((ulong)char1 ^ 2) != (ushort)*(byte *)((ulong)char2 ^ 3)) {
          return 0;
        }
        char2 = char2 + 1;
        char1 = char1 + 2;
        uVar1 = (int)uVar2 - 1;
        uVar2 = (ulong)uVar1;
      } while (uVar1 != 0);
    }
  }
  else if (fat1 == 0) {
    if (length != 0) {
      do {
        if (*(char *)((ulong)char1 ^ 3) != *(char *)((ulong)char2 ^ 3)) {
          return 0;
        }
        char1 = char1 + 1;
        char2 = char2 + 1;
        uVar1 = (int)uVar2 - 1;
        uVar2 = (ulong)uVar1;
      } while (uVar1 != 0);
    }
  }
  else if (length != 0) {
    do {
      if (*(short *)((ulong)char1 ^ 2) != *(short *)((ulong)char2 ^ 2)) {
        return 0;
      }
      char1 = char1 + 2;
      char2 = char2 + 2;
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  return 1;
}

Assistant:

LispPTR compare_lisp_chars(const char *char1, const char *char2, DLword length,
                           DLword fat1, DLword fat2) {
  if ((!fat1) == (!fat2)) { /* both fat or both non-fat. */
#ifdef BYTESWAP
    if (fat1) { /* both fat, so compare 'em a word at a time */
      int i;
      for (i = 0; i < length; i++) {
        if (GETWORD(char1) != GETWORD(char2)) return (NIL);
        /* increment by size of fat character, i.e., DLword, 2 bytes */
        char1+= sizeof(DLword); char2+=sizeof(DLword);
      }
      return (T);
    } else { /* both thin, so compare 'em a byte at a time */
             /* (it's this way in case we're byte-swapped.)*/
      int i;
      for (i = 0; i < length; i++)
        if (GETBYTE(char1++) != GETBYTE(char2++)) return (NIL);
      return (T);
    }
#else
    /* This one fails for byte-swapped machines */
    if (fat1) length = length + length;
    if (memcmp(char1, char2, length) == 0)
      return (T);
    else {
      return (NIL);
    }
#endif /* BYTESWAP */

  } else if (fat1) { /* char1 is fat, char2 isn't */
      if (lispcmp((const DLword *)char1, char2, length))
      return (T);
    else
      return (NIL);
  } else { /* char2 is fat, char1 isn't */
      if (lispcmp((const DLword *)char2, char1, length))
      return (T);
    else
      return (NIL);
  }

}